

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_ManUpdateOrder(Sbd_Man_t *p,int Pivot)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  int *piVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  if ((-1 < Pivot) && (Pivot < p->vLutLevs->nSize)) {
    iVar1 = p->vLutLevs->pArray[(uint)Pivot];
    pVVar5 = p->vDivLevels;
    iVar11 = pVVar5->nSize;
    if (0 < (long)iVar11) {
      pVVar4 = pVVar5->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)&pVVar4->nSize + lVar7) = 0;
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar11 * 0x10 != lVar7);
    }
    pVVar5->nSize = 0;
    iVar11 = (int)((long)iVar1 + 1);
    if (pVVar5->nCap <= iVar1) {
      sVar8 = ((long)iVar1 + 1) * 0x10;
      if (pVVar5->pArray == (Vec_Int_t *)0x0) {
        pVVar4 = (Vec_Int_t *)malloc(sVar8);
      }
      else {
        pVVar4 = (Vec_Int_t *)realloc(pVVar5->pArray,sVar8);
      }
      pVVar5->pArray = pVVar4;
      memset(pVVar4 + pVVar5->nCap,0,((long)iVar11 - (long)pVVar5->nCap) * 0x10);
      pVVar5->nCap = iVar11;
    }
    pVVar5->nSize = iVar11;
    pVVar4 = p->vWinObjs;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        iVar11 = pVVar4->pArray[lVar7];
        if (((long)iVar11 < 0) || (p->vLutLevs->nSize <= iVar11)) goto LAB_005313ff;
        pVVar5 = p->vDivLevels;
        uVar2 = p->vLutLevs->pArray[iVar11];
        if (pVVar5->nSize <= (int)uVar2) {
          iVar9 = uVar2 + 1;
          iVar3 = pVVar5->nSize * 2;
          if (iVar3 <= iVar9) {
            iVar3 = iVar9;
          }
          if (pVVar5->nCap < iVar3) {
            sVar8 = (long)iVar3 << 4;
            if (pVVar5->pArray == (Vec_Int_t *)0x0) {
              pVVar4 = (Vec_Int_t *)malloc(sVar8);
            }
            else {
              pVVar4 = (Vec_Int_t *)realloc(pVVar5->pArray,sVar8);
            }
            pVVar5->pArray = pVVar4;
            memset(pVVar4 + pVVar5->nCap,0,((long)iVar3 - (long)pVVar5->nCap) * 0x10);
            pVVar5->nCap = iVar3;
          }
          pVVar5->nSize = iVar9;
        }
        if (((int)uVar2 < 0) || (pVVar5->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush(pVVar5->pArray + uVar2,iVar11);
        lVar7 = lVar7 + 1;
        pVVar4 = p->vWinObjs;
      } while (lVar7 < pVVar4->nSize);
    }
    pVVar4->nSize = 0;
    pVVar5 = p->vDivLevels;
    if (pVVar5->nSize < 1) {
      iVar11 = 0;
    }
    else {
      uVar10 = 0;
      iVar11 = 0;
      do {
        pVVar4 = pVVar5->pArray;
        qsort(pVVar4[uVar10].pArray,(long)pVVar4[uVar10].nSize,4,Vec_IntSortCompare1);
        if (0 < pVVar4[uVar10].nSize) {
          lVar7 = 0;
          do {
            iVar3 = pVVar4[uVar10].pArray[lVar7];
            if (((long)iVar3 < 0) || (p->vObj2Var->nSize <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p_00 = p->vWinObjs;
            p->vObj2Var->pArray[iVar3] = p_00->nSize;
            Vec_IntPush(p_00,iVar3);
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar4[uVar10].nSize);
        }
        if (uVar10 == iVar1 - 2) {
          iVar11 = p->vWinObjs->nSize;
        }
        uVar10 = uVar10 + 1;
        pVVar5 = p->vDivLevels;
      } while ((long)uVar10 < (long)pVVar5->nSize);
    }
    if (iVar11 < 1) {
      __assert_fail("nTimeValidDivs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x16d,"void Sbd_ManUpdateOrder(Sbd_Man_t *, int)");
    }
    p->vDivVars->nSize = 0;
    p->DivCutoff = -1;
    iVar3 = 0x3f;
    if (0x3f < iVar11) {
      iVar3 = iVar11;
    }
    if ((int)(iVar3 - 0x3fU) < iVar11) {
      uVar10 = (ulong)(iVar3 - 0x3fU);
      do {
        if ((long)p->vWinObjs->nSize <= (long)uVar10) goto LAB_005313ff;
        if (p->DivCutoff == -1) {
          uVar2 = p->vWinObjs->pArray[uVar10];
          if (((int)uVar2 < 0) || (p->vLutLevs->nSize <= (int)uVar2)) goto LAB_005313ff;
          if (p->vLutLevs->pArray[uVar2] == iVar1 + -2) {
            p->DivCutoff = p->vDivVars->nSize;
          }
        }
        Vec_IntPush(p->vDivVars,(int)uVar10);
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < iVar11);
    }
    if (p->DivCutoff == -1) {
      p->DivCutoff = 0;
    }
    pVVar4 = p->vDivValues;
    uVar2 = p->vDivVars->nSize;
    if (pVVar4->nCap < (int)uVar2) {
      if (pVVar4->pArray == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar6 = (int *)realloc(pVVar4->pArray,(long)(int)uVar2 << 2);
      }
      pVVar4->pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset(pVVar4->pArray,0,(ulong)uVar2 * 4);
    }
    pVVar4->nSize = uVar2;
    return;
  }
LAB_005313ff:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_ManUpdateOrder( Sbd_Man_t * p, int Pivot )
{
    int i, k, Node;
    Vec_Int_t * vLevel;
    int nTimeValidDivs = 0;
    // collect divisors by logic level
    int LevelMax = Vec_IntEntry(p->vLutLevs, Pivot);
    Vec_WecClear( p->vDivLevels );
    Vec_WecInit( p->vDivLevels, LevelMax + 1 );
    Vec_IntForEachEntry( p->vWinObjs, Node, i )
        Vec_WecPush( p->vDivLevels, Vec_IntEntry(p->vLutLevs, Node), Node );
    // reload divisors
    Vec_IntClear( p->vWinObjs );
    Vec_WecForEachLevel( p->vDivLevels, vLevel, i )
    {
        Vec_IntSort( vLevel, 0 );
        Vec_IntForEachEntry( vLevel, Node, k )
        {
            Vec_IntWriteEntry( p->vObj2Var, Node, Vec_IntSize(p->vWinObjs) );
            Vec_IntPush( p->vWinObjs, Node );
        }
        // remember divisor cutoff
        if ( i == LevelMax - 2 )
            nTimeValidDivs = Vec_IntSize(p->vWinObjs);
    }
    assert( nTimeValidDivs > 0 );
    Vec_IntClear( p->vDivVars );
    p->DivCutoff = -1;
    Vec_IntForEachEntryStartStop( p->vWinObjs, Node, i, Abc_MaxInt(0, nTimeValidDivs-63), nTimeValidDivs )
    {
        if ( p->DivCutoff == -1 && Vec_IntEntry(p->vLutLevs, Node) == LevelMax - 2 )
            p->DivCutoff = Vec_IntSize(p->vDivVars);
        Vec_IntPush( p->vDivVars, i );
    }
    if ( p->DivCutoff == -1 )
        p->DivCutoff = 0;
    // verify
/*
    assert( Vec_IntSize(p->vDivVars) < 64 );
    Vec_IntForEachEntryStart( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) == LevelMax - 2 );
    Vec_IntForEachEntryStop( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) < LevelMax - 2 );
*/
    Vec_IntFill( p->vDivValues, Vec_IntSize(p->vDivVars), 0 );
    //printf( "%d ", Vec_IntSize(p->vDivVars) );
//    printf( "Node %4d :  Win = %5d.   Divs = %5d.    D1 = %5d.  D2 = %5d.\n",  
//        Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vDivVars), Vec_IntSize(p->vDivVars)-p->DivCutoff, p->DivCutoff );
}